

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestBuildCommand::InitialPass
          (cmCTestBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string_view value;
  string_view value_00;
  string local_48;
  
  bVar2 = cmCTestHandlerCommand::InitialPass(&this->super_cmCTestHandlerCommand,args,status);
  if ((this->NumberErrors)._M_string_length != 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::to_string(&local_48,this->Handler->TotalErrors);
    value._M_str = local_48._M_dataplus._M_p;
    value._M_len = local_48._M_string_length;
    cmMakefile::AddDefinition(pcVar1,&this->NumberErrors,value);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((this->NumberWarnings)._M_string_length != 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::to_string(&local_48,this->Handler->TotalWarnings);
    value_00._M_str = local_48._M_dataplus._M_p;
    value_00._M_len = local_48._M_string_length;
    cmMakefile::AddDefinition(pcVar1,&this->NumberWarnings,value_00);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar2;
}

Assistant:

bool cmCTestBuildCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& status)
{
  bool ret = this->cmCTestHandlerCommand::InitialPass(args, status);
  if (!this->NumberErrors.empty()) {
    this->Makefile->AddDefinition(
      this->NumberErrors, std::to_string(this->Handler->GetTotalErrors()));
  }
  if (!this->NumberWarnings.empty()) {
    this->Makefile->AddDefinition(
      this->NumberWarnings, std::to_string(this->Handler->GetTotalWarnings()));
  }
  return ret;
}